

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f5_get_stem_contributions_d53
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  short sVar1;
  uint uVar2;
  vrna_param_t *p;
  int *piVar3;
  int *piVar4;
  code *pcVar5;
  code *pcVar6;
  short *psVar7;
  char *pcVar8;
  vrna_sc_t *pvVar9;
  short **ppsVar10;
  uint **ppuVar11;
  uchar uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  void *__ptr;
  void *__ptr_00;
  int local_100;
  int local_f8;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int *stems;
  int *c;
  int turn;
  int *indx;
  int local_98;
  int ij;
  int i;
  uint type;
  uint **a2s;
  uint local_80;
  uint n_seq;
  uint s;
  uint n;
  short *ssj1;
  short *s3j1;
  short **S3;
  short **S5;
  short **SS;
  short *psStack_48;
  short sj1;
  short *si1;
  short *S;
  char *ptype;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar17 = (int *)vrna_alloc(j << 2);
  uVar14 = fc->length;
  p = fc->params;
  piVar3 = fc->jindx;
  piVar4 = (fc->matrices->field_2).field_0.c;
  iVar16 = (p->model_details).min_loop_size;
  indx._4_4_ = (piVar3[j + -1] + j) - iVar16;
  pcVar5 = (code *)sc_wrapper->decomp_stem1;
  pcVar6 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar7 = (fc->field_23).field_0.sequence_encoding;
    pcVar8 = (fc->field_23).field_0.ptype;
    sVar1 = psVar7[j];
    psStack_48 = psVar7 + ((long)j - (long)iVar16);
    iVar13 = j - iVar16;
    while( true ) {
      psStack_48 = psStack_48 + -1;
      local_98 = iVar13 + -1;
      if (local_98 < 2) break;
      piVar17[local_98] = 10000000;
      if ((piVar4[indx._4_4_] != 10000000) &&
         (uVar12 = (*evaluate)(1,j,iVar13 + -2,iVar13,'\x13',hc_dat_local), uVar12 != '\0')) {
        uVar14 = vrna_get_ptype(indx._4_4_,pcVar8);
        iVar13 = piVar4[indx._4_4_];
        iVar15 = vrna_E_ext_stem(uVar14,(int)*psStack_48,(int)sVar1,p);
        piVar17[local_98] = iVar13 + iVar15;
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar13 = local_98;
    }
    if (pcVar5 != (code *)0x0) {
      local_98 = j - iVar16;
      while (iVar16 = local_98, local_98 = iVar16 + -1, 1 < local_98) {
        if (piVar17[local_98] != 10000000) {
          iVar16 = (*pcVar5)(j,iVar16 + -2,iVar16,sc_wrapper);
          piVar17[local_98] = iVar16 + piVar17[local_98];
        }
      }
    }
    piVar17[1] = 10000000;
    iVar16 = piVar3[j + -1] + 2;
    if ((piVar4[iVar16] != 10000000) &&
       (uVar12 = (*evaluate)(1,j,2,j + -1,'\x0e',hc_dat_local), uVar12 != '\0')) {
      uVar14 = vrna_get_ptype(iVar16,pcVar8);
      iVar16 = piVar4[iVar16];
      iVar13 = vrna_E_ext_stem(uVar14,(int)psVar7[1],(int)sVar1,p);
      piVar17[1] = iVar16 + iVar13;
      if (pcVar6 != (code *)0x0) {
        iVar16 = (*pcVar6)(j,2,j + -1,sc_wrapper);
        piVar17[1] = iVar16 + piVar17[1];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar2 = (fc->field_23).field_1.n_seq;
    pcVar8 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar9 = (fc->field_23).field_0.sc;
    ppsVar10 = (fc->field_23).field_1.S3;
    ppuVar11 = (fc->field_23).field_1.a2s;
    __ptr = vrna_alloc(uVar2 << 1);
    __ptr_00 = vrna_alloc(uVar2 << 1);
    for (local_80 = 0; local_80 < uVar2; local_80 = local_80 + 1) {
      if (ppuVar11[local_80][j + -1] < ppuVar11[local_80][uVar14]) {
        sVar1 = ppsVar10[local_80][j + -1];
      }
      else {
        sVar1 = -1;
      }
      *(short *)((long)__ptr + (ulong)local_80 * 2) = sVar1;
      *(undefined2 *)((long)__ptr_00 + (ulong)local_80 * 2) =
           *(undefined2 *)(*(long *)(pcVar8 + (ulong)local_80 * 8) + (long)(j + -1) * 2);
    }
    iVar13 = j - iVar16;
    while (local_98 = iVar13 + -1, 1 < local_98) {
      piVar17[local_98] = 10000000;
      if ((piVar4[indx._4_4_] != 10000000) &&
         (uVar12 = (*evaluate)(1,j,iVar13 + -2,iVar13,'\x13',hc_dat_local), uVar12 != '\0')) {
        piVar17[local_98] = piVar4[indx._4_4_];
        for (local_80 = 0; local_80 < uVar2; local_80 = local_80 + 1) {
          uVar14 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar8 + (ulong)local_80 * 8) +
                                                    (long)iVar13 * 2),
                                     (int)*(short *)((long)__ptr_00 + (ulong)local_80 * 2),
                                     &p->model_details);
          if (ppuVar11[local_80][iVar13] < 2) {
            local_f8 = -1;
          }
          else {
            local_f8 = (int)*(short *)(*(long *)(&pvVar9->type + (ulong)local_80 * 2) +
                                      (long)iVar13 * 2);
          }
          iVar15 = vrna_E_ext_stem(uVar14,local_f8,
                                   (int)*(short *)((long)__ptr + (ulong)local_80 * 2),p);
          piVar17[local_98] = iVar15 + piVar17[local_98];
        }
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar13 = local_98;
    }
    if (pcVar5 != (code *)0x0) {
      local_98 = j - iVar16;
      while (iVar16 = local_98, local_98 = iVar16 + -1, 1 < local_98) {
        if (piVar17[local_98] != 10000000) {
          iVar16 = (*pcVar5)(j,iVar16 + -2,iVar16,sc_wrapper);
          piVar17[local_98] = iVar16 + piVar17[local_98];
        }
      }
    }
    piVar17[1] = 10000000;
    iVar16 = piVar3[j + -1];
    if ((piVar4[iVar16 + 2] != 10000000) &&
       (uVar12 = (*evaluate)(1,j,2,j + -1,'\x0e',hc_dat_local), uVar12 != '\0')) {
      piVar17[1] = piVar4[iVar16 + 2];
      for (local_80 = 0; local_80 < uVar2; local_80 = local_80 + 1) {
        uVar14 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar8 + (ulong)local_80 * 8) + 4),
                                   (int)*(short *)((long)__ptr_00 + (ulong)local_80 * 2),
                                   &p->model_details);
        if (ppuVar11[local_80][2] < 2) {
          local_100 = -1;
        }
        else {
          local_100 = (int)*(short *)(*(long *)(&pvVar9->type + (ulong)local_80 * 2) + 4);
        }
        iVar16 = vrna_E_ext_stem(uVar14,local_100,(int)*(short *)((long)__ptr + (ulong)local_80 * 2)
                                 ,p);
        piVar17[1] = iVar16 + piVar17[1];
      }
      if (pcVar6 != (code *)0x0) {
        iVar16 = (*pcVar6)(j,2,j + -1,sc_wrapper);
        piVar17[1] = iVar16 + piVar17[1];
      }
    }
    free(__ptr);
    free(__ptr_00);
  }
  return piVar17;
}

Assistant:

int *
f5_get_stem_contributions_d53(vrna_fold_compound_t      *fc,
                              int                       j,
                              vrna_callback_hc_evaluate *evaluate,
                              struct default_data       *hc_dat_local,
                              struct sc_wrapper_f5      *sc_wrapper)
{
  char                    *ptype;
  short                   *S, *si1, sj1, **SS, **S5, **S3, *s3j1, *ssj1;
  unsigned int            n, s, n_seq, **a2s, type;
  int                     i, ij, *indx, turn, *c, *stems;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  n     = fc->length;
  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = md->min_loop_size;
  ij    = indx[j - 1] + j - turn;

  sc_spl_stem = sc_wrapper->decomp_stem1;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      S     = fc->sequence_encoding;
      ptype = fc->ptype;
      sj1   = S[j];
      si1   = S + j - turn - 1;

      for (i = j - turn - 1; i > 1; i--, ij--, si1--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i + 1, VRNA_DECOMP_EXT_EXT_STEM1, hc_dat_local))) {
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  = c[ij] +
                      vrna_E_ext_stem(type, *si1, sj1, P);
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i + 1, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j - 1] + 2;

      if ((c[ij] != INF) && (evaluate(1, j, 2, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  = c[ij] +
                    vrna_E_ext_stem(type, S[1], sj1, P);

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 2, j - 1, sc_wrapper);
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      SS    = fc->S;
      S5    = fc->S5;
      S3    = fc->S3;
      a2s   = fc->a2s;

      /* pre-compute S3[s][j - 1] */
      s3j1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      ssj1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++) {
        s3j1[s] = (a2s[s][j - 1] < a2s[s][n]) ? S3[s][j - 1] : -1;
        ssj1[s] = SS[s][j - 1];
      }

      for (i = j - turn - 1; i > 1; i--, ij--, si1--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i + 1, VRNA_DECOMP_EXT_EXT_STEM1, hc_dat_local))) {
          stems[i] = c[ij];
          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(SS[s][i + 1], ssj1[s], md);
            stems[i]  += vrna_E_ext_stem(type, (a2s[s][i + 1] > 1) ? S5[s][i + 1] : -1, s3j1[s], P);
          }
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i + 1, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j - 1] + 2;

      if ((c[ij] != INF) && (evaluate(1, j, 2, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        stems[1] = c[ij];
        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(SS[s][2], ssj1[s], md);
          stems[1]  += vrna_E_ext_stem(type, (a2s[s][2] > 1) ? S5[s][2] : -1, s3j1[s], P);
        }

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 2, j - 1, sc_wrapper);
      }

      free(s3j1);
      free(ssj1);

      break;
  }

  return stems;
}